

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::CFLPredictTest_PredictTest_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::CFLPredictTest_PredictTest_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<unsigned_char,void(*(*)(unsigned_char))(short_const*,unsigned_char*,int,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x68);
  Test::Test(this_00);
  *(undefined4 *)
   ((long)&this_00[2].gtest_flag_saver_._M_t.
           super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
           .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl + 4) =
       0xbaba;
  this_00->_vptr_Test = (_func_int **)&PTR__CFLPredictTest_00ffbec8;
  this_00[1]._vptr_Test = (_func_int **)&DAT_00ffbf08;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__CFLPredictTest_PredictTest_Test_00ffbf28;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }